

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall summarycalc::loaditemtocoverage(summarycalc *this)

{
  int __status;
  FILE *__stream;
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  item itm;
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&file,"input/items.bin",(allocator *)&itm);
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&file);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itm,
                   &this->inputpath_,&local_50);
    std::__cxx11::string::operator=((string *)&file,(string *)&itm);
    std::__cxx11::string::~string((string *)&itm);
    std::__cxx11::string::~string((string *)&local_50);
  }
  __stream = fopen(file._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s cannot open %s\n","loaditemtocoverage",file._M_dataplus._M_p);
    __status = 1;
  }
  else {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    fseek(__stream,0,0);
    itm.id = 0;
    std::vector<int,_std::allocator<int>_>::resize
              (&this->item_to_coverage_,(ulong)((int)((uVar1 & 0xffffffff) / 0x14) + 1),&itm.id);
    lVar3 = 1;
    sVar2 = fread(&itm,0x14,1,__stream);
    while( true ) {
      if (sVar2 == 0) {
        fclose(__stream);
        std::__cxx11::string::~string((string *)&file);
        return;
      }
      if ((int)lVar3 != itm.id) break;
      (this->item_to_coverage_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar3] = itm.coverage_id;
      sVar2 = fread(&itm,0x14,1,__stream);
      lVar3 = lVar3 + 1;
    }
    fwrite("FATAL: Item ids are not contiguous or do not start from one",0x3b,1,_stderr);
    __status = -1;
  }
  exit(__status);
}

Assistant:

void summarycalc::loaditemtocoverage()
{
	FILE* fin = NULL;
	std::string file = ITEMS_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);
	int last_item_id = 0;
	unsigned int nrec = (unsigned int)sz / (unsigned int)sizeof(item);
	item_to_coverage_.resize(nrec + 1, 0);

	item itm;
	size_t i = fread(&itm, sizeof(itm), 1, fin);
	while (i != 0) {
		last_item_id++;
		if (itm.id != last_item_id) {
			fprintf(stderr, "FATAL: Item ids are not contiguous or do not start from one");
			exit(-1);
		}
		last_item_id = itm.id;
		item_to_coverage_[itm.id] = itm.coverage_id;
		i = fread(&itm, sizeof(itm), 1, fin);
	}
	fclose(fin);

}